

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O3

void __thiscall
iu_AssertionTest_x_iutest_x_Pred5_Test::Body(iu_AssertionTest_x_iutest_x_Pred5_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  allocator<char> local_209;
  AssertionResult iutest_ar;
  _Alloc_hider in_stack_fffffffffffffe20;
  _func_bool_int_int_int_int_int *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uStack_1cc;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  ios_base local_130 [264];
  
  iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
             in_stack_fffffffffffffe20._M_p,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe50);
  bVar2 = iutest_ar.m_result;
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)&stack0xfffffffffffffe50,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&stack0xfffffffffffffe50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe20,iutest_ar.m_message._M_dataplus._M_p,&local_209);
    in_stack_fffffffffffffe40 = 0x32e139;
    in_stack_fffffffffffffe48 = 0x37;
    iutest::AssertionHelper::OnFixed
              ((AssertionHelper *)&stack0xfffffffffffffe20,(Fixed *)&stack0xfffffffffffffe50,false);
    if (in_stack_fffffffffffffe20._M_p != &stack0xfffffffffffffe30) {
      operator_delete(in_stack_fffffffffffffe20._M_p,
                      CONCAT44(uStack_1cc,in_stack_fffffffffffffe30) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
    std::ios_base::~ios_base(local_130);
  }
  paVar1 = &iutest_ar.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                    iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
               in_stack_fffffffffffffe20._M_p,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe50,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe20,iutest_ar.m_message._M_dataplus._M_p,&local_209)
      ;
      in_stack_fffffffffffffe40 = 0x32e139;
      in_stack_fffffffffffffe48 = 0x38;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&stack0xfffffffffffffe20,(Fixed *)&stack0xfffffffffffffe50,false
                );
      if (in_stack_fffffffffffffe20._M_p != &stack0xfffffffffffffe30) {
        operator_delete(in_stack_fffffffffffffe20._M_p,
                        CONCAT44(uStack_1cc,in_stack_fffffffffffffe30) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
      std::ios_base::~ios_base(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
               in_stack_fffffffffffffe20._M_p,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe50,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe20,iutest_ar.m_message._M_dataplus._M_p,&local_209)
      ;
      in_stack_fffffffffffffe40 = 0x32e139;
      in_stack_fffffffffffffe48 = 0x39;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&stack0xfffffffffffffe20,(Fixed *)&stack0xfffffffffffffe50,false
                );
      if (in_stack_fffffffffffffe20._M_p != &stack0xfffffffffffffe30) {
        operator_delete(in_stack_fffffffffffffe20._M_p,
                        CONCAT44(uStack_1cc,in_stack_fffffffffffffe30) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
      std::ios_base::~ios_base(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
               in_stack_fffffffffffffe20._M_p,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe50,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe20,iutest_ar.m_message._M_dataplus._M_p,&local_209)
      ;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&stack0xfffffffffffffe20,(Fixed *)&stack0xfffffffffffffe50,false
                );
      if (in_stack_fffffffffffffe20._M_p != &stack0xfffffffffffffe30) {
        operator_delete(in_stack_fffffffffffffe20._M_p,
                        CONCAT44(uStack_1cc,in_stack_fffffffffffffe30) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
      std::ios_base::~ios_base(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(AssertionTest, Pred5)
{
    IUTEST_ASSERT_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_EXPECT_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_INFORM_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_ASSUME_PRED5(PredTest5, 0, 1, 2, 3, 4);
}